

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNESTMeanYieldsBenchmarks.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  VDetector *detector;
  RandomGen *this;
  ostream *poVar2;
  uint64_t s;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  LArNESTResult *pLVar6;
  size_t i;
  long lVar7;
  pointer pdVar8;
  long *plVar9;
  ulong uVar10;
  byte bVar11;
  initializer_list<NEST::LArInteraction> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<double,_std::allocator<double>_> electric_field;
  vector<double,_std::allocator<double>_> energy_vals;
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> particle_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  particle_type;
  ofstream output_file;
  LArNEST larnest;
  ulong local_8c0;
  void *local_8b8;
  void *pvStack_8b0;
  long local_8a8;
  ulong local_8a0;
  vector<double,_std::allocator<double>_> local_898;
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> local_878;
  double local_860;
  pointer local_858;
  double local_850;
  double local_848;
  double local_840;
  double local_838;
  double local_830;
  double local_828;
  double local_820;
  LArNESTResult local_818;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_798;
  long local_780;
  filebuf local_778 [240];
  ios_base local_688 [264];
  undefined1 local_580 [32];
  undefined1 *local_560;
  undefined1 local_550 [16];
  long *local_540 [2];
  long local_530 [160];
  
  bVar11 = 0;
  if (argc < 2) {
    local_860 = 1.393;
  }
  else {
    local_860 = atof(argv[1]);
    if (argc != 2) {
      iVar1 = atoi(argv[2]);
      s = (uint64_t)iVar1;
      goto LAB_00103b49;
    }
  }
  s = 0;
LAB_00103b49:
  local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  lVar7 = 0;
  do {
    local_580._0_8_ = (double)lVar7 * 0.019998 + 0.1;
    if (local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_898,
                 (iterator)
                 local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)local_580);
    }
    else {
      *local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_580._0_8_;
      local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 50000);
  local_580._0_8_ = (pointer)0x100000000;
  local_580._8_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)local_580;
  std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::vector
            (&local_878,__l,(allocator_type *)&local_780);
  local_580._0_8_ = local_580 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"NR","");
  local_560 = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"ER","");
  plVar9 = local_530;
  local_540[0] = plVar9;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"Alpha","");
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_580;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_798,__l_00,(allocator_type *)&local_780);
  lVar7 = -0x60;
  do {
    if (plVar9 != (long *)plVar9[-2]) {
      operator_delete((long *)plVar9[-2],*plVar9 + 1);
    }
    plVar9 = plVar9 + -4;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0);
  detector = (VDetector *)operator_new(0x128);
  LArDetector::LArDetector((LArDetector *)detector);
  NEST::LArNEST::LArNEST((LArNEST *)local_580,detector);
  this = RandomGen::rndm();
  RandomGen::SetSeed(this,s);
  std::ofstream::ofstream(&local_780);
  std::ofstream::open((char *)&local_780,0x116254);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_780,
             "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_std,Ne_std,Nex_std,Nion_std\n"
             ,0x93);
  if (local_878.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_878.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pdVar3 = (pointer)0x0;
    pdVar8 = (pointer)0x0;
  }
  else {
    uVar10 = 0;
    pdVar8 = (pointer)0x0;
    pdVar3 = (pointer)0x0;
    do {
      local_8b8 = (void *)0x0;
      pvStack_8b0 = (void *)0x0;
      local_8a8 = 0;
      if (local_878.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar10] == ER) {
        pdVar5 = (double *)&DAT_00116198;
        pLVar6 = &local_818;
        for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pLVar6->yields).TotalYield = *pdVar5;
          pdVar5 = pdVar5 + (ulong)bVar11 * -2 + 1;
          pLVar6 = (LArNESTResult *)((long)pLVar6 + ((ulong)bVar11 * -2 + 1) * 8);
        }
        std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_8b8,0,&local_818,
                   &local_818.fluctuations.NeFluctuation);
      }
      else if (local_878.
               super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar10] == NR) {
        pdVar5 = (double *)&DAT_00116148;
        pLVar6 = &local_818;
        for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pLVar6->yields).TotalYield = *pdVar5;
          pdVar5 = pdVar5 + (ulong)bVar11 * -2 + 1;
          pLVar6 = (LArNESTResult *)((long)pLVar6 + ((ulong)bVar11 * -2 + 1) * 8);
        }
        std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_8b8,0,&local_818,
                   &local_818.fluctuations.NeFluctuation);
      }
      else {
        local_818.yields.Nion = 10000.0;
        local_818.yields.Lindhard = 20000.0;
        local_818.yields.Ne = 1000.0;
        local_818.yields.Nex = 5000.0;
        local_818.yields.LightYield = 100.0;
        local_818.yields.Nph = 500.0;
        local_818.yields.TotalYield._0_4_ = 0;
        local_818.yields.TotalYield._4_4_ = 0x3ff00000;
        local_818.yields.QuantaYield._0_4_ = 0;
        local_818.yields.QuantaYield._4_4_ = 0x40490000;
        std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_8b8,0,&local_818,
                   &local_818.yields.ElectricField);
      }
      if (pvStack_8b0 != local_8b8) {
        local_8c0 = 0;
        local_8a0 = uVar10;
        do {
          lVar7 = 0;
          pdVar4 = pdVar3;
          do {
            NEST::LArNEST::FullCalculation
                      (&local_818,(LArNEST *)local_580,
                       local_878.
                       super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_8a0],
                       local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar7],0.0,
                       *(double *)((long)local_8b8 + local_8c0 * 8),local_860,false);
            pdVar3 = local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            local_820 = (double)CONCAT44(local_818.yields.TotalYield._4_4_,
                                         local_818.yields.TotalYield._0_4_);
            local_828 = (double)CONCAT44(local_818.yields.QuantaYield._4_4_,
                                         local_818.yields.QuantaYield._0_4_);
            local_830 = local_818.yields.LightYield;
            local_838 = local_818.yields.Nph;
            local_840 = local_818.yields.Ne;
            local_848 = local_818.yields.Nex;
            local_850 = local_818.yields.Nion;
            local_858 = local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if ((pdVar8 != (pointer)0x0) &&
               (operator_delete(pdVar8,(long)pdVar4 - (long)pdVar8),
               local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_818.photon_times.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_818.photon_times.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_818.photon_times.
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_780,
                                local_798.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[local_8a0]._M_dataplus.
                                _M_p,local_798.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[local_8a0].
                                     _M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_898.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar7]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(*(double *)((long)local_8b8 + local_8c0 * 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_820);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_828);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_830);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_838);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_840);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_848);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_850);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",0,0,0,0,0,0,0\n",0xf);
            lVar7 = lVar7 + 1;
            pdVar4 = pdVar3;
            pdVar8 = local_858;
          } while (lVar7 != 50000);
          local_8c0 = local_8c0 + 1;
          uVar10 = local_8a0;
        } while (local_8c0 < (ulong)((long)pvStack_8b0 - (long)local_8b8 >> 3));
      }
      if (local_8b8 != (void *)0x0) {
        operator_delete(local_8b8,local_8a8 - (long)local_8b8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)local_878.
                                    super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_878.
                                    super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::ofstream::close();
  local_780 = _VTT;
  *(undefined8 *)(local_778 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_778);
  std::ios_base::~ios_base(local_688);
  if (pdVar8 != (pointer)0x0) {
    operator_delete(pdVar8,(long)pdVar3 - (long)pdVar8);
  }
  NEST::LArNEST::~LArNEST((LArNEST *)local_580);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_798);
  if (local_878.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_878.
                    super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_878.
                          super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_878.
                          super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_898.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  // this sample program takes can take two arguments,
  // (optional) 1) density - the density of the LAr to use
  // (optional) 2) seed - a seed for the random number generator

  double density = 1.393;
  uint64_t seed = 0;
  if (argc > 1) {
    density = atof(argv[1]);
  }
  if (argc > 2) {
    seed = atoi(argv[2]);
  }

  // set up energy steps
  int num_energy_steps = 50000;
  std::vector<double> energy_vals;
  double start_val = .1;
  double end_val = 1000;
  double step_size = (end_val - start_val) / num_energy_steps;

  for (size_t i = 0; i < num_energy_steps; i++) {
    energy_vals.emplace_back(start_val + step_size * i);
  }
  std::vector<NEST::LArInteraction> particle_types = {
      NEST::LArInteraction::NR, NEST::LArInteraction::ER,
      NEST::LArInteraction::Alpha};
  std::vector<std::string> particle_type = {"NR", "ER", "Alpha"};

  LArDetector* detector = new LArDetector();
  // Construct NEST class using detector object
  NEST::LArNEST larnest(detector);
  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(seed);

  // Construct NEST objects for storing calculation results
  NEST::LArNESTResult result;
  std::ofstream output_file;

  output_file.open("mean_yields_benchmarks.csv");
  output_file << "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,"
                 "Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_"
                 "std,Ne_std,Nex_std,Nion_std\n";

  // iterate over electric field values
  for (size_t k = 0; k < particle_types.size(); k++) {
    std::vector<double> electric_field;
    if (particle_types[k] == NEST::LArInteraction::NR) {
      electric_field.insert(electric_field.end(), {1, 50, 100, 200, 250, 500,
                                                   1000, 1500, 1750, 2000});
    } else if (particle_types[k] == NEST::LArInteraction::ER) {
      electric_field.insert(electric_field.end(), {1, 100, 200, 600, 1000, 1500,
                                                   2500, 6000, 9000, 9500});
    } else {
      electric_field.insert(electric_field.end(),
                            {1, 50, 100, 500, 1000, 5000, 10000, 20000});
    }
    for (size_t v = 0; v < electric_field.size(); v++) {
      // iterate over energy values
      for (size_t i = 0; i < num_energy_steps; i++) {
        result = larnest.FullCalculation(particle_types[k], energy_vals[i], 0,
                                         electric_field[v], density, false);
        output_file << particle_type[k] << ",";
        output_file << energy_vals[i] << ",";
        output_file << electric_field[v] << ",";
        output_file << result.yields.TotalYield << ",";
        output_file << result.yields.QuantaYield << ",";
        output_file << result.yields.LightYield << ",";
        output_file << result.yields.Nph << ",";
        output_file << result.yields.Ne << ",";
        output_file << result.yields.Nex << ",";
        output_file << result.yields.Nion << ",0,0,0,0,0,0,0\n";
      }
    }
  }
  output_file.close();
  return 0;
}